

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintRequestedDocumentation(cmDocumentation *this,ostream *os)

{
  pointer pRVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pRVar5;
  ofstream *os_00;
  int iVar6;
  ofstream fout;
  
  pRVar1 = (this->RequestedHelpItems).
           super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar6 = 0;
  bVar2 = true;
  for (pRVar5 = (this->RequestedHelpItems).
                super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar5 != pRVar1; pRVar5 = pRVar5 + 1) {
    std::__cxx11::string::_M_assign((string *)&this->CurrentArgument);
    std::ofstream::ofstream(&fout);
    if ((pRVar5->Filename)._M_string_length == 0) {
      iVar4 = iVar6 + 1;
      bVar3 = 0 < iVar6;
      os_00 = (ofstream *)os;
      iVar6 = iVar4;
      if (bVar3) {
        std::operator<<(os,"\n\n");
      }
    }
    else {
      std::ofstream::open((char *)&fout,(_Ios_Openmode)(pRVar5->Filename)._M_dataplus._M_p);
      os_00 = &fout;
    }
    bVar3 = PrintDocumentation(this,pRVar5->HelpType,
                               &os_00->super_basic_ostream<char,_std::char_traits<char>_>);
    if ((!bVar3) ||
       (((&(os_00->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20)
         [(long)(os_00->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream[-3]]
        & 5) != 0)) {
      bVar2 = false;
    }
    std::ofstream::~ofstream(&fout);
  }
  return bVar2;
}

Assistant:

bool cmDocumentation::PrintRequestedDocumentation(std::ostream& os)
{
  int count = 0;
  bool result = true;

  // Loop over requested documentation types.
  for (RequestedHelpItem const& rhi : this->RequestedHelpItems) {
    this->CurrentArgument = rhi.Argument;
    // If a file name was given, use it.  Otherwise, default to the
    // given stream.
    cmsys::ofstream fout;
    std::ostream* s = &os;
    if (!rhi.Filename.empty()) {
      fout.open(rhi.Filename.c_str());
      s = &fout;
    } else if (++count > 1) {
      os << "\n\n";
    }

    // Print this documentation type to the stream.
    if (!this->PrintDocumentation(rhi.HelpType, *s) || s->fail()) {
      result = false;
    }
  }
  return result;
}